

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  Mat *pMVar3;
  size_t sVar4;
  size_t *psVar5;
  undefined4 *puVar6;
  int *piVar7;
  pointer pMVar8;
  pointer pMVar9;
  byte bVar10;
  int iVar11;
  undefined4 *puVar12;
  long lVar13;
  int iVar14;
  pointer pMVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  undefined4 *puVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  undefined4 *puVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  size_t sVar28;
  undefined4 *puVar29;
  void *pvVar30;
  long lVar31;
  bool bVar32;
  int local_c8;
  Mat local_80;
  Mat *local_38;
  
  pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar9->dims;
  iVar11 = *(int *)(&this->field_0xd0 + (long)this->_vptr_Concat_x86[-3]);
  if (uVar1 == 1) {
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar13 == 0) {
      uVar17 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar7 = &pMVar9->w;
      uVar17 = 0;
      do {
        uVar17 = uVar17 + piVar7[-5] * *piVar7;
        piVar7 = piVar7 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    bVar10 = (uVar17 & 3) == 0 & opt->use_packing_layout;
    iVar23 = (uint)bVar10 + (uint)bVar10 * 2 + 1;
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,(int)uVar17 / iVar23,
                pMVar9->elemsize / (ulong)(long)pMVar9->elempack << bVar10 * '\x02',iVar23,
                opt->blob_allocator);
    pvVar30 = pMVar3->data;
    if (pvVar30 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar3->c * pMVar3->cstep == 0) {
      return -100;
    }
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar9) {
      lVar13 = 0x2c;
      uVar26 = 0;
      do {
        memcpy(pvVar30,*(void **)((long)pMVar9 + lVar13 + -0x2c),
               (long)*(int *)((long)&pMVar9->data + lVar13) *
               *(long *)((long)pMVar9 + lVar13 + -0x1c));
        pvVar30 = (void *)((long)pvVar30 +
                          (long)*(int *)((long)pMVar9 + lVar13 + -0x14) *
                          (long)*(int *)((long)&pMVar9->data + lVar13) * 4);
        uVar26 = uVar26 + 1;
        pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x48;
      } while (uVar26 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
  }
  iVar11 = (iVar11 >> 0x1f & uVar1) + iVar11;
  if ((uVar1 == 2) && (iVar11 == 0)) {
    iVar23 = pMVar9->w;
    sVar28 = pMVar9->elemsize;
    iVar18 = pMVar9->elempack;
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar13 == 0) {
      uVar17 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar7 = &pMVar9->h;
      uVar17 = 0;
      do {
        if (*(ulong *)(piVar7 + -8) < sVar28) {
          sVar28 = *(ulong *)(piVar7 + -8);
        }
        iVar14 = piVar7[-6];
        if (iVar14 < iVar18) {
          iVar18 = iVar14;
        }
        uVar17 = uVar17 + iVar14 * *piVar7;
        piVar7 = piVar7 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    bVar10 = (uVar17 & 3) == 0 & opt->use_packing_layout;
    iVar14 = (uint)bVar10 + (uint)bVar10 * 2 + 1;
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,iVar23,(int)uVar17 / iVar14,sVar28 / (ulong)(long)iVar18 << bVar10 * '\x02',
                iVar14,opt->blob_allocator);
    local_80.data = pMVar3->data;
    if ((undefined4 *)local_80.data == (undefined4 *)0x0) {
      return -100;
    }
    local_80.cstep = pMVar3->cstep;
    local_80.c = pMVar3->c;
    if (local_80.cstep * (long)local_80.c == 0) {
      return -100;
    }
    local_80.refcount = pMVar3->refcount;
    local_80.elemsize = pMVar3->elemsize;
    local_80.elempack = pMVar3->elempack;
    local_80.allocator = pMVar3->allocator;
    local_80.dims = pMVar3->dims;
    local_80.w = pMVar3->w;
    local_80.h = pMVar3->h;
    local_80.d = pMVar3->d;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    if ((iVar18 < iVar14) &&
       ((Mat::create(&local_80,iVar23,(int)uVar17 / iVar18,sVar28,iVar18,opt->workspace_allocator),
        (undefined4 *)local_80.data == (undefined4 *)0x0 || ((long)local_80.c * local_80.cstep == 0)
        ))) {
      if (local_80.refcount == (int *)0x0) {
        return -100;
      }
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount != 0) {
        return -100;
      }
      if (local_80.allocator != (Allocator *)0x0) {
        (*(local_80.allocator)->_vptr_Allocator[3])();
        return -100;
      }
      if ((undefined4 *)local_80.data == (undefined4 *)0x0) {
        return -100;
      }
      free(local_80.data);
      return -100;
    }
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar8 != pMVar9) {
      lVar13 = (long)iVar23;
      uVar26 = 0;
      puVar6 = (undefined4 *)local_80.data;
      do {
        pMVar15 = pMVar9 + uVar26;
        iVar21 = pMVar15->elempack;
        if (((iVar21 == 4) && (iVar18 == 1)) && (iVar19 = pMVar15->h, 0 < (long)iVar19)) {
          pvVar30 = pMVar15->data;
          iVar2 = pMVar15->w;
          sVar28 = pMVar15->elemsize;
          lVar22 = 0;
          do {
            if (0 < iVar23) {
              puVar24 = (undefined4 *)((long)iVar2 * sVar28 * lVar22 + (long)pvVar30);
              puVar12 = puVar6;
              iVar25 = iVar23;
              do {
                *puVar12 = *puVar24;
                puVar12[lVar13] = puVar24[1];
                puVar12[iVar23 * 2] = puVar24[2];
                puVar12[iVar23 * 3] = puVar24[3];
                puVar12 = puVar12 + 1;
                puVar24 = puVar24 + 4;
                iVar25 = iVar25 + -1;
              } while (iVar25 != 0);
            }
            puVar6 = puVar6 + lVar13 * 4;
            lVar22 = lVar22 + 1;
          } while (lVar22 != iVar19);
        }
        if (iVar21 == iVar18) {
          lVar22 = pMVar15->h * lVar13;
          memcpy(puVar6,pMVar15->data,pMVar15->elemsize * lVar22);
          local_c8 = (int)lVar22;
          puVar6 = puVar6 + (long)local_c8 * (long)pMVar15->elempack;
          pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 < (ulong)(((long)pMVar8 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
    }
    if (iVar18 < iVar14) {
      convert_packing(&local_80,pMVar3,iVar14,opt);
    }
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_80.data != (undefined4 *)0x0) {
            free(local_80.data);
          }
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if ((uVar1 == 2) && (iVar11 == 1)) {
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = pMVar9->h;
    sVar28 = pMVar9->elemsize;
    iVar23 = pMVar9->elempack;
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar13 == 0) {
      iVar18 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar7 = &pMVar9->w;
      iVar18 = 0;
      do {
        iVar18 = iVar18 + *piVar7;
        piVar7 = piVar7 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,iVar18,uVar17,sVar28,iVar23,opt->blob_allocator);
    if (pMVar3->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar3->c * pMVar3->cstep == 0) {
      return -100;
    }
    if (0 < (int)uVar17) {
      uVar26 = 0;
      pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        pMVar15 = pMVar9;
        if (pMVar8 != pMVar9) {
          pvVar30 = (void *)((long)pMVar3->w * uVar26 * pMVar3->elemsize + (long)pMVar3->data);
          lVar13 = 0x2c;
          uVar27 = 0;
          do {
            lVar22 = (long)*(int *)((long)&pMVar15->data + lVar13);
            memcpy(pvVar30,(void *)(uVar26 * lVar22 * *(long *)((long)pMVar15 + lVar13 + -0x1c) +
                                   *(long *)((long)pMVar15 + lVar13 + -0x2c)),lVar22 * sVar28);
            pvVar30 = (void *)((long)pvVar30 +
                              (long)*(int *)((long)&pMVar15->data + lVar13) * (long)iVar23 * 4);
            uVar27 = uVar27 + 1;
            pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            lVar13 = lVar13 + 0x48;
          } while (uVar27 < (ulong)(((long)pMVar9 - (long)pMVar15 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar26 = uVar26 + 1;
        pMVar8 = pMVar9;
        pMVar9 = pMVar15;
      } while (uVar26 != uVar17);
    }
  }
  if ((uVar1 == 3) && (iVar11 == 0)) {
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar23 = pMVar9->w;
    iVar18 = pMVar9->h;
    sVar28 = pMVar9->elemsize;
    iVar14 = pMVar9->elempack;
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar13 == 0) {
      uVar17 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      psVar5 = &pMVar9->elemsize;
      uVar17 = 0;
      do {
        if (*psVar5 < sVar28) {
          sVar28 = *psVar5;
        }
        iVar21 = *(int *)(psVar5 + 1);
        if (iVar21 < iVar14) {
          iVar14 = iVar21;
        }
        uVar17 = uVar17 + iVar21 * *(int *)(psVar5 + 5);
        psVar5 = psVar5 + 9;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    bVar10 = (uVar17 & 3) == 0 & opt->use_packing_layout;
    iVar21 = (uint)bVar10 + (uint)bVar10 * 2 + 1;
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,iVar23,iVar18,(int)uVar17 / iVar21,
                sVar28 / (ulong)(long)iVar14 << bVar10 * '\x02',iVar21,opt->blob_allocator);
    local_80.data = pMVar3->data;
    if ((undefined4 *)local_80.data == (undefined4 *)0x0) {
      return -100;
    }
    local_80.cstep = pMVar3->cstep;
    local_80.c = pMVar3->c;
    if (local_80.cstep * (long)local_80.c == 0) {
      return -100;
    }
    local_80.refcount = pMVar3->refcount;
    local_80.elemsize = pMVar3->elemsize;
    local_80.elempack = pMVar3->elempack;
    local_80.allocator = pMVar3->allocator;
    local_80.dims = pMVar3->dims;
    local_80.w = pMVar3->w;
    local_80.h = pMVar3->h;
    local_80.d = pMVar3->d;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    local_38 = pMVar3;
    if ((iVar14 < iVar21) &&
       ((Mat::create(&local_80,iVar23,iVar18,(int)uVar17 / iVar14,sVar28,iVar14,
                     opt->workspace_allocator), (undefined4 *)local_80.data == (undefined4 *)0x0 ||
        ((long)local_80.c * local_80.cstep == 0)))) {
      Mat::~Mat(&local_80);
      return -100;
    }
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar8 != pMVar9) {
      uVar27 = 0;
      uVar26 = 0;
      do {
        pMVar15 = pMVar9 + uVar27;
        iVar23 = pMVar15->elempack;
        if (((iVar23 == 4) && (iVar14 == 1)) && (iVar18 = pMVar15->c, 0 < (long)iVar18)) {
          iVar19 = pMVar15->h * pMVar15->w;
          sVar28 = pMVar15->cstep;
          sVar4 = pMVar15->elemsize;
          pvVar30 = pMVar15->data;
          lVar22 = local_80.cstep * local_80.elemsize;
          uVar26 = (ulong)(int)uVar26;
          puVar29 = (undefined4 *)((uVar26 + 3) * lVar22 + (long)local_80.data);
          puVar12 = (undefined4 *)((uVar26 + 2) * lVar22 + (long)local_80.data);
          puVar6 = (undefined4 *)((uVar26 + 1) * lVar22 + (long)local_80.data);
          puVar24 = (undefined4 *)(lVar22 * uVar26 + (long)local_80.data);
          lVar13 = 0;
          do {
            if (0 < iVar19) {
              puVar20 = (undefined4 *)(sVar28 * sVar4 * lVar13 + (long)pvVar30);
              lVar31 = 0;
              do {
                puVar24[lVar31] = *puVar20;
                puVar6[lVar31] = puVar20[1];
                puVar12[lVar31] = puVar20[2];
                puVar29[lVar31] = puVar20[3];
                puVar20 = puVar20 + 4;
                lVar31 = lVar31 + 1;
              } while (iVar19 != (int)lVar31);
            }
            uVar26 = uVar26 + 4;
            lVar13 = lVar13 + 1;
            puVar29 = puVar29 + lVar22;
            puVar12 = puVar12 + lVar22;
            puVar6 = puVar6 + lVar22;
            puVar24 = puVar24 + lVar22;
          } while (lVar13 != iVar18);
        }
        if (iVar23 == iVar14) {
          memcpy((undefined4 *)
                 (local_80.cstep * (long)(int)uVar26 * local_80.elemsize + (long)local_80.data),
                 pMVar15->data,(long)((int)pMVar15->cstep * pMVar15->c) * pMVar15->elemsize);
          uVar26 = (ulong)(uint)((int)uVar26 + pMVar15->c);
          pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 < (ulong)(((long)pMVar8 - (long)pMVar9 >> 3) * -0x71c71c71c71c71c7));
    }
    if (iVar14 < iVar21) {
      convert_packing(&local_80,local_38,iVar21,opt);
    }
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_80.data != (undefined4 *)0x0) {
            free(local_80.data);
          }
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if ((uVar1 == 3) && (iVar11 == 1)) {
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar17 = pMVar9->c;
    sVar28 = pMVar9->elemsize;
    iVar23 = pMVar9->elempack;
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar13 == 0) {
      iVar18 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar7 = &pMVar9->h;
      iVar18 = 0;
      do {
        iVar18 = iVar18 + *piVar7;
        piVar7 = piVar7 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,pMVar9->w,iVar18,uVar17,sVar28,iVar23,opt->blob_allocator);
    if (pMVar3->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar3->c * pMVar3->cstep == 0) {
      return -100;
    }
    if (0 < (int)uVar17) {
      pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar26 = 0;
      do {
        bVar32 = pMVar9 != pMVar8;
        pMVar9 = pMVar8;
        if (bVar32) {
          pvVar30 = (void *)(pMVar3->cstep * uVar26 * pMVar3->elemsize + (long)pMVar3->data);
          lVar13 = 0x40;
          uVar27 = 0;
          do {
            lVar22 = (long)*(int *)((long)pMVar8 + lVar13 + -0x10) *
                     (long)*(int *)((long)pMVar8 + lVar13 + -0x14);
            memcpy(pvVar30,(void *)(*(long *)((long)&pMVar8->data + lVar13) * uVar26 *
                                    *(long *)((long)pMVar8 + lVar13 + -0x30) +
                                   *(long *)((long)pMVar8 + lVar13 + -0x40)),lVar22 * sVar28);
            pvVar30 = (void *)((long)pvVar30 + (long)((int)lVar22 * iVar23) * 4);
            uVar27 = uVar27 + 1;
            pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            lVar13 = lVar13 + 0x48;
          } while (uVar27 < (ulong)(((long)pMVar9 - (long)pMVar8 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar17);
    }
  }
  iVar23 = 0;
  if ((uVar1 == 3) && (iVar11 == 2)) {
    pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = pMVar9->h;
    uVar17 = pMVar9->c;
    sVar28 = pMVar9->elemsize;
    iVar11 = pMVar9->elempack;
    lVar13 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar9;
    if (lVar13 == 0) {
      iVar23 = 0;
    }
    else {
      lVar13 = (lVar13 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = lVar13 + (ulong)(lVar13 == 0);
      piVar7 = &pMVar9->w;
      iVar23 = 0;
      do {
        iVar23 = iVar23 + *piVar7;
        piVar7 = piVar7 + 0x12;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,iVar23,uVar1,uVar17,sVar28,iVar11,opt->blob_allocator);
    iVar23 = -100;
    if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
      if ((int)uVar17 < 1) {
        iVar23 = 0;
      }
      else {
        uVar26 = 0;
        do {
          if (0 < (int)uVar1) {
            pvVar30 = (void *)(pMVar3->cstep * uVar26 * pMVar3->elemsize + (long)pMVar3->data);
            uVar27 = 0;
            pMVar8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              pMVar15 = pMVar9;
              if (pMVar8 != pMVar9) {
                lVar13 = 0x40;
                uVar16 = 0;
                do {
                  lVar31 = (long)*(int *)((long)pMVar15 + lVar13 + -0x14);
                  lVar22 = *(long *)((long)pMVar15 + lVar13 + -0x30);
                  memcpy(pvVar30,(void *)(uVar27 * lVar31 * lVar22 +
                                         *(long *)((long)&pMVar15->data + lVar13) * uVar26 * lVar22
                                         + *(long *)((long)pMVar15 + lVar13 + -0x40)),
                         lVar31 * sVar28);
                  pvVar30 = (void *)((long)pvVar30 +
                                    (long)*(int *)((long)pMVar15 + lVar13 + -0x14) * (long)iVar11 *
                                    4);
                  uVar16 = uVar16 + 1;
                  pMVar15 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  pMVar9 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_finish;
                  lVar13 = lVar13 + 0x48;
                } while (uVar16 < (ulong)(((long)pMVar9 - (long)pMVar15 >> 3) * -0x71c71c71c71c71c7)
                        );
              }
              uVar27 = uVar27 + 1;
              pMVar8 = pMVar9;
              pMVar9 = pMVar15;
            } while (uVar27 != uVar1);
          }
          uVar26 = uVar26 + 1;
          iVar23 = 0;
        } while (uVar26 != uVar17);
      }
    }
  }
  return iVar23;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}